

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O3

void FAudio_OPERATIONSET_ClearAll(FAudio *audio)

{
  FAudio_OPERATIONSET_Type FVar1;
  FAudio_OPERATIONSET_Operation *pFVar2;
  FAudioFreeFunc p_Var3;
  FAudio_OPERATIONSET_Operation *pFVar4;
  long lVar5;
  
  FAudio_PlatformLockMutex(audio->operationLock);
  pFVar4 = audio->queuedOperations;
  do {
    if (pFVar4 == (FAudio_OPERATIONSET_Operation *)0x0) {
      audio->queuedOperations = (FAudio_OPERATIONSET_Operation *)0x0;
      FAudio_PlatformUnlockMutex(audio->operationLock);
      return;
    }
    pFVar2 = pFVar4->next;
    p_Var3 = audio->pFree;
    FVar1 = pFVar4->Type;
    lVar5 = 0x18;
    if ((FVar1 == FAUDIOOP_SETEFFECTPARAMETERS) || (FVar1 == FAUDIOOP_SETCHANNELVOLUMES)) {
LAB_0011c8d9:
      (*p_Var3)(*(void **)((long)&pFVar4->Type + lVar5));
    }
    else if (FVar1 == FAUDIOOP_SETOUTPUTMATRIX) {
      lVar5 = 0x20;
      goto LAB_0011c8d9;
    }
    (*p_Var3)(pFVar4);
    pFVar4 = pFVar2;
  } while( true );
}

Assistant:

void FAudio_OPERATIONSET_ClearAll(FAudio *audio)
{
	FAudio_OPERATIONSET_Operation *current, *next;

	FAudio_PlatformLockMutex(audio->operationLock);
	LOG_MUTEX_LOCK(audio, audio->operationLock)

	current = audio->queuedOperations;
	while (current != NULL)
	{
		next = current->next;
		DeleteOperation(current, audio->pFree);
		current = next;
	}
	audio->queuedOperations = NULL;

	FAudio_PlatformUnlockMutex(audio->operationLock);
	LOG_MUTEX_UNLOCK(audio, audio->operationLock)
}